

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O1

string * __thiscall FeatureVec::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureVec *this)

{
  pointer pfVar1;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pfVar1 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    uVar2 = 0;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",(double)pfVar1[uVar2],in_R8,in_R9,paVar3);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = uVar2 + 1;
      pfVar1 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->values).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FeatureVec::toString() {
  std::string str;
  for (size_t f = 0; f < values.size(); f++) {
    str += std::to_string(values[f]);
    str += f < values.size() - 1 ? ", " : "";
  }
  return str;
}